

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.cc
# Opt level: O0

Optional<webrtc::CartesianPoint<float>_>
webrtc::GetDirectionIfLinear
          (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           *array_geometry)

{
  undefined8 uVar1;
  bool bVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  size_type sVar5;
  Point PVar6;
  float local_200 [2];
  float local_1f8;
  undefined1 local_1ec [8];
  Point pair_direction;
  size_t i;
  float local_1d0;
  undefined1 local_1c8 [8];
  Point first_pair_direction;
  FatalMessage local_1b0;
  uint local_34;
  size_type local_30;
  string *local_28;
  string *_result;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  *array_geometry_local;
  
  _result = (string *)array_geometry;
  local_30 = std::
             vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             ::size(array_geometry);
  local_34 = 1;
  local_28 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                       (&local_30,&local_34,"array_geometry.size() > 1u");
  if (local_28 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/array_util.cc"
               ,0x3d,local_28);
    rtc::FatalMessage::stream(&local_1b0);
    rtc::FatalMessage::~FatalMessage(&local_1b0);
  }
  pvVar3 = std::
           vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
           operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                       *)_result,0);
  pvVar4 = std::
           vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
           operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                       *)_result,1);
  PVar6 = PairDirection(pvVar3,pvVar4);
  i = PVar6.c._0_8_;
  local_1c8 = (undefined1  [8])i;
  local_1d0 = PVar6.c[2];
  first_pair_direction.c[0] = local_1d0;
  pair_direction.c[1] = 2.8026e-45;
  pair_direction.c[2] = 0.0;
  while( true ) {
    uVar1 = pair_direction.c._4_8_;
    sVar5 = std::
            vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>::
            size((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                  *)_result);
    if (sVar5 <= (ulong)uVar1) {
      rtc::Optional<webrtc::CartesianPoint<float>_>::Optional
                ((Optional<webrtc::CartesianPoint<float>_> *)&array_geometry_local,
                 (CartesianPoint<float> *)local_1c8);
      return _array_geometry_local;
    }
    pvVar3 = std::
             vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             ::operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                           *)_result,pair_direction.c._4_8_ - 1);
    pvVar4 = std::
             vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             ::operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                           *)_result,pair_direction.c._4_8_);
    PVar6 = PairDirection(pvVar3,pvVar4);
    local_200 = PVar6.c._0_8_;
    local_1ec._0_4_ = local_200[0];
    local_1ec._4_4_ = local_200[1];
    local_1f8 = PVar6.c[2];
    pair_direction.c[0] = local_1f8;
    bVar2 = AreParallel((Point *)local_1c8,(Point *)local_1ec);
    if (!bVar2) break;
    pair_direction.c._4_8_ = pair_direction.c._4_8_ + 1;
  }
  rtc::Optional<webrtc::CartesianPoint<float>_>::Optional
            ((Optional<webrtc::CartesianPoint<float>_> *)&array_geometry_local);
  return _array_geometry_local;
}

Assistant:

rtc::Optional<Point> GetDirectionIfLinear(
    const std::vector<Point>& array_geometry) {
  RTC_DCHECK_GT(array_geometry.size(), 1u);
  const Point first_pair_direction =
      PairDirection(array_geometry[0], array_geometry[1]);
  for (size_t i = 2u; i < array_geometry.size(); ++i) {
    const Point pair_direction =
        PairDirection(array_geometry[i - 1], array_geometry[i]);
    if (!AreParallel(first_pair_direction, pair_direction)) {
      return rtc::Optional<Point>();
    }
  }
  return rtc::Optional<Point>(first_pair_direction);
}